

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pr.cpp
# Opt level: O3

int main(void)

{
  string tid;
  ostringstream oss;
  string local_1a8;
  id local_188;
  ostringstream local_180 [112];
  ios_base local_110 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  local_188._M_thread = pthread_self();
  tid_to_string_abi_cxx11_(&local_1a8,&local_188);
  if (1 < pr_level) {
    printf("[%-5s][%s:%d] tid is:%s\n","info","main",0x12,local_1a8._M_dataplus._M_p);
  }
  pr_set_level(3);
  pr_test("debug");
  pr_set_level(2);
  pr_test("info");
  pr_set_level(1);
  pr_test("warn");
  pr_set_level(0);
  pr_test("error");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_180);
  std::ios_base::~ios_base(local_110);
  return 0;
}

Assistant:

int main()
{
    ostringstream oss;
    string tid = tid_to_string(this_thread::get_id());
    PR_INFO("tid is:%s\n", tid.c_str());

    pr_set_level(PR_LEVEL_DEBUG);
    pr_test("debug");

    pr_set_level(PR_LEVEL_INFO);
    pr_test("info");

    pr_set_level(PR_LEVEL_WARN);
    pr_test("warn");

    pr_set_level(PR_LEVEL_ERROR);
    pr_test("error");

    return 0;
}